

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O0

void shade_rect(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  int iVar1;
  int iVar2;
  Fl_Color FVar3;
  uchar *puVar4;
  size_t sVar5;
  int local_44;
  int cstep;
  int chalf;
  int clen;
  int j;
  int i;
  uchar *g;
  Fl_Color bc_local;
  char *c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  puVar4 = fl_gray_ramp();
  sVar5 = strlen(c);
  iVar1 = (int)sVar5 + -1;
  iVar2 = iVar1 / 2;
  local_44 = 1;
  if (SBORROW4(h,w * 2) == h + w * -2 < 0) {
    if (w <= iVar1) {
      local_44 = 2;
    }
    clen = 0;
    for (chalf = 0; chalf < iVar2; chalf = local_44 + chalf) {
      FVar3 = shade_color(puVar4[(int)c[clen]],bc);
      fl_color(FVar3);
      fl_yxline(x + clen,y + 1,y + h + -1);
      FVar3 = shade_color(puVar4[c[clen] + -2],bc);
      fl_color(FVar3);
      fl_point(x + clen + 1,y);
      fl_point(x + clen + 1,y + h);
      FVar3 = shade_color(puVar4[(int)c[iVar1 - clen]],bc);
      fl_color(FVar3);
      fl_yxline((x + w + -1) - clen,y + 1,y + h + -1);
      FVar3 = shade_color(puVar4[c[iVar1 - clen] + -2],bc);
      fl_color(FVar3);
      fl_point((x + w + -2) - clen,y);
      fl_point((x + w + -2) - clen,y + h);
      clen = clen + 1;
    }
    local_44 = iVar2 / local_44;
    FVar3 = shade_color(puVar4[(int)c[iVar2]],bc);
    fl_color(FVar3);
    fl_rectf(x + local_44,y + 1,w + local_44 * -2,h + -1);
    FVar3 = shade_color(puVar4[c[iVar2] + -2],bc);
    fl_color(FVar3);
    fl_xyline(x + local_44,y,(x + w) - local_44);
    fl_xyline(x + local_44,y + h,(x + w) - local_44);
  }
  else {
    if (h <= iVar1) {
      local_44 = 2;
    }
    clen = 0;
    for (chalf = 0; chalf < iVar2; chalf = local_44 + chalf) {
      FVar3 = shade_color(puVar4[(int)c[clen]],bc);
      fl_color(FVar3);
      fl_xyline(x + 1,y + clen,x + w + -2);
      FVar3 = shade_color(puVar4[c[clen] + -2],bc);
      fl_color(FVar3);
      fl_point(x,y + clen + 1);
      fl_point(x + w + -1,y + clen + 1);
      FVar3 = shade_color(puVar4[(int)c[iVar1 - clen]],bc);
      fl_color(FVar3);
      fl_xyline(x + 1,(y + h) - clen,x + w + -2);
      FVar3 = shade_color(puVar4[c[iVar1 - clen] + -2],bc);
      fl_color(FVar3);
      fl_point(x,(y + h) - clen);
      fl_point(x + w + -1,(y + h) - clen);
      clen = clen + 1;
    }
    local_44 = iVar2 / local_44;
    FVar3 = shade_color(puVar4[(int)c[iVar2]],bc);
    fl_color(FVar3);
    fl_rectf(x + 1,y + local_44,w + -2,h + local_44 * -2 + 1);
    FVar3 = shade_color(puVar4[c[iVar2] + -2],bc);
    fl_color(FVar3);
    fl_yxline(x,y + local_44,(y + h) - local_44);
    fl_yxline(x + w + -1,y + local_44,(y + h) - local_44);
  }
  return;
}

Assistant:

static void shade_rect(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  int	i, j;
  int	clen = (int) strlen(c) - 1;
  int	chalf = clen / 2;
  int	cstep = 1;

  if (h < (w * 2)) {
    // Horizontal shading...
    if (clen >= h) cstep = 2;

    for (i = 0, j = 0; j < chalf; i ++, j += cstep) {
      // Draw the top line and points...
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_xyline(x + 1, y + i, x + w - 2);

      fl_color(shade_color(g[c[i] - 2], bc));
      fl_point(x, y + i + 1);
      fl_point(x + w - 1, y + i + 1);

      // Draw the bottom line and points...
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_xyline(x + 1, y + h - i, x + w - 2);

      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_point(x, y + h - i);
      fl_point(x + w - 1, y + h - i);
    }

    // Draw the interior and sides...
    i = chalf / cstep;

    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x + 1, y + i, w - 2, h - 2 * i + 1);

    fl_color(shade_color(g[c[chalf] - 2], bc));
    fl_yxline(x, y + i, y + h - i);
    fl_yxline(x + w - 1, y + i, y + h - i);
  } else {
    // Vertical shading...
    if (clen >= w) cstep = 2;

    for (i = 0, j = 0; j < chalf; i ++, j += cstep) {
      // Draw the left line and points...
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_yxline(x + i, y + 1, y + h - 1);

      fl_color(shade_color(g[c[i] - 2], bc));
      fl_point(x + i + 1, y);
      fl_point(x + i + 1, y + h);

      // Draw the right line and points...
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_yxline(x + w - 1 - i, y + 1, y + h - 1);

      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_point(x + w - 2 - i, y);
      fl_point(x + w - 2 - i, y + h);
    }

    // Draw the interior, top, and bottom...
    i = chalf / cstep;

    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x + i, y + 1, w - 2 * i, h - 1);

    fl_color(shade_color(g[c[chalf] - 2], bc));
    fl_xyline(x + i, y, x + w - i);
    fl_xyline(x + i, y + h, x + w - i);
  }
}